

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdAddTxSignByHandle
              (void *handle,void *create_handle,char *txid,uint32_t vout,int hash_type,
              char *sign_data_hex,bool use_der_encode,int sighash_type,bool sighash_anyone_can_pay,
              bool clear_stack)

{
  initializer_list<cfd::SignParameter> __l;
  undefined1 uVar1;
  bool bVar2;
  undefined8 uVar3;
  uint32_t in_ECX;
  SigHashType *in_RDX;
  SignParameter *in_RSI;
  char *in_R9;
  byte in_stack_00000008;
  uint8_t in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext *tx_1;
  TransactionContext *tx;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_list;
  ByteData signature_bytes;
  SigHashType sighashtype;
  SignParameter param;
  bool is_witness;
  AddressType addr_type;
  OutPoint outpoint;
  bool is_bitcoin;
  CfdCapiTransactionData *tx_data;
  undefined1 in_stack_fffffffffffffabe;
  undefined1 in_stack_fffffffffffffabf;
  SignParameter *in_stack_fffffffffffffac0;
  OutPoint *in_stack_fffffffffffffac8;
  ConfidentialTransactionContext *in_stack_fffffffffffffad0;
  CfdError in_stack_fffffffffffffadc;
  SignParameter *in_stack_fffffffffffffae0;
  SigHashType *in_stack_fffffffffffffae8;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_fffffffffffffaf0;
  undefined1 **ppuVar4;
  iterator in_stack_fffffffffffffaf8;
  undefined1 **ppuVar5;
  SignParameter *in_stack_fffffffffffffb00;
  bool *in_stack_fffffffffffffb18;
  allocator *paVar6;
  undefined8 in_stack_fffffffffffffb20;
  int network_type;
  SignParameter *in_stack_fffffffffffffb58;
  SignParameter *in_stack_fffffffffffffb60;
  undefined7 in_stack_fffffffffffffb78;
  SignParameter *this;
  undefined1 in_stack_fffffffffffffba7;
  string *in_stack_fffffffffffffba8;
  SignParameter *in_stack_fffffffffffffbb0;
  string *in_stack_fffffffffffffbc8;
  undefined1 *in_stack_fffffffffffffbd0;
  undefined1 *local_3b8;
  undefined8 local_3b0;
  SigHashType local_390;
  allocator local_381;
  string local_380 [156];
  SigHashType local_2e4 [11];
  allocator local_259;
  string local_258;
  ByteData local_238;
  SigHashType local_21c [11];
  undefined1 local_192;
  allocator local_191;
  string local_190 [32];
  CfdSourceLocation local_170;
  byte local_151;
  AddressType local_150;
  allocator local_149;
  string local_148;
  Txid local_128;
  OutPoint local_108;
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [37];
  byte local_b3;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  SignParameter *local_78;
  allocator local_69;
  string local_68 [53];
  byte local_33;
  byte local_32;
  byte local_31;
  char *local_30;
  uint32_t local_24;
  SigHashType *local_20;
  SignParameter *local_18;
  int local_4;
  
  network_type = (int)((ulong)in_stack_fffffffffffffb20 >> 0x20);
  local_31 = in_stack_00000008 & 1;
  local_32 = in_stack_00000018 & 1;
  local_33 = in_stack_00000020 & 1;
  local_30 = in_R9;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  this = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"TransactionData",&local_69);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  local_78 = local_18;
  uVar1 = cfd::capi::IsEmptyString((char *)local_20);
  if ((bool)uVar1) {
    local_90.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_90.filename = local_90.filename + 1;
    local_90.line = 0x4bd;
    local_90.funcname = "CfdAddTxSignByHandle";
    cfd::core::logger::warn<>(&local_90,"txid is null or empty.");
    local_b2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"Failed to parameter. txid is null or empty.",&local_b1);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
               (string *)in_stack_fffffffffffffad0);
    local_b2 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_b3 = 0;
  cfd::capi::ConvertNetType(network_type,in_stack_fffffffffffffb18);
  if (*(long *)&local_78->data_type_ != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,(char *)local_20,&local_149);
    cfd::core::Txid::Txid(&local_128,&local_148);
    cfd::core::OutPoint::OutPoint(&local_108,&local_128,local_24);
    cfd::core::Txid::~Txid((Txid *)0x610af3);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    local_150 = cfd::capi::ConvertHashToAddressType(network_type);
    local_151 = 1;
    if ((local_150 == kP2shAddress) || (local_150 == kP2pkhAddress)) {
      local_151 = 0;
    }
    if ((local_30 != (char *)0x0) &&
       ((bVar2 = cfd::capi::IsEmptyString(local_30), !bVar2 ||
        (((local_31 & 1) == 0 && ((local_151 & 1) != 0)))))) {
      cfd::SignParameter::SignParameter(in_stack_fffffffffffffae0);
      if ((local_31 & 1) == 0) {
        paVar6 = &local_381;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_380,local_30,paVar6);
        cfd::core::SigHashType::SigHashType(&local_390,kSigHashAll,false,false);
        cfd::SignParameter::SignParameter
                  (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                   (bool)in_stack_fffffffffffffba7,in_RDX);
        cfd::SignParameter::operator=(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
        cfd::SignParameter::~SignParameter(in_stack_fffffffffffffac0);
        std::__cxx11::string::~string(local_380);
        std::allocator<char>::~allocator((allocator<char> *)&local_381);
      }
      else {
        cfd::core::SigHashType::Create(local_21c,in_stack_00000010,(bool)(local_32 & 1),false);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_258,local_30,&local_259);
        cfd::core::ByteData::ByteData(&local_238,&local_258);
        std::__cxx11::string::~string((string *)&local_258);
        std::allocator<char>::~allocator((allocator<char> *)&local_259);
        cfd::core::SigHashType::SigHashType(local_2e4,local_21c);
        cfd::SignParameter::SignParameter
                  (in_stack_fffffffffffffb00,&in_stack_fffffffffffffaf8->data_,
                   SUB81((ulong)in_stack_fffffffffffffaf0 >> 0x38,0),in_stack_fffffffffffffae8);
        cfd::SignParameter::operator=(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
        cfd::SignParameter::~SignParameter(in_stack_fffffffffffffac0);
        cfd::core::ByteData::~ByteData((ByteData *)0x610e74);
      }
      cfd::SignParameter::SignParameter
                (this,(SignParameter *)CONCAT17(uVar1,in_stack_fffffffffffffb78));
      local_3b8 = &stack0xfffffffffffffbd0;
      local_3b0 = 1;
      std::allocator<cfd::SignParameter>::allocator((allocator<cfd::SignParameter> *)0x61108e);
      __l._M_len = (size_type)in_stack_fffffffffffffb00;
      __l._M_array = in_stack_fffffffffffffaf8;
      std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
                (in_stack_fffffffffffffaf0,__l,(allocator_type *)in_stack_fffffffffffffae8);
      std::allocator<cfd::SignParameter>::~allocator((allocator<cfd::SignParameter> *)0x6110bf);
      ppuVar5 = (undefined1 **)&stack0xfffffffffffffbd0;
      ppuVar4 = &local_3b8;
      do {
        ppuVar4 = ppuVar4 + -0xf;
        cfd::SignParameter::~SignParameter(in_stack_fffffffffffffac0);
      } while (ppuVar4 != ppuVar5);
      if ((local_b3 & 1) == 0) {
        cfd::ConfidentialTransactionContext::AddSign
                  (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                   (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                   in_stack_fffffffffffffac0,(bool)in_stack_fffffffffffffabf,
                   (bool)in_stack_fffffffffffffabe);
      }
      else {
        cfd::TransactionContext::AddSign
                  ((TransactionContext *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,
                   (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                   in_stack_fffffffffffffac0,(bool)in_stack_fffffffffffffabf,
                   (bool)in_stack_fffffffffffffabe);
      }
      local_4 = 0;
      std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
                ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
                 in_stack_fffffffffffffad0);
      cfd::SignParameter::~SignParameter(in_stack_fffffffffffffac0);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x6112bf);
      return local_4;
    }
    local_170.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_170.filename = local_170.filename + 1;
    local_170.line = 0x4d4;
    local_170.funcname = "CfdAddTxSignByHandle";
    cfd::core::logger::warn<>(&local_170,"sign data is null or empty.");
    local_192 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_190,"Failed to parameter. sign data is null or empty.",&local_191);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
               (string *)in_stack_fffffffffffffad0);
    local_192 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_da = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  paVar6 = &local_d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Invalid handle state. tx is null",paVar6);
  cfd::core::CfdException::CfdException
            ((CfdException *)in_stack_fffffffffffffae0,in_stack_fffffffffffffadc,
             (string *)in_stack_fffffffffffffad0);
  local_da = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTxSignByHandle(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    int hash_type, const char* sign_data_hex, bool use_der_encode,
    int sighash_type, bool sighash_anyone_can_pay, bool clear_stack) {
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    }
    OutPoint outpoint(Txid(txid), vout);

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    bool is_witness = true;
    if ((addr_type == AddressType::kP2shAddress) ||
        (addr_type == AddressType::kP2pkhAddress)) {
      is_witness = false;
    }

    if ((sign_data_hex == nullptr) ||
        (IsEmptyString(sign_data_hex) && (use_der_encode || !is_witness))) {
      warn(CFD_LOG_SOURCE, "sign data is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sign data is null or empty.");
    }

    SignParameter param;
    if (use_der_encode) {
      // encode to der
      SigHashType sighashtype = SigHashType::Create(
          static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
      ByteData signature_bytes = ByteData(std::string(sign_data_hex));
      param = SignParameter(signature_bytes, true, sighashtype);
    } else {
      param = SignParameter(std::string(sign_data_hex));
    }
    std::vector<SignParameter> sign_list = {param};

    if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      tx->AddSign(outpoint, sign_list, is_witness, clear_stack);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      tx->AddSign(outpoint, sign_list, is_witness, clear_stack);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}